

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * __thiscall
parser::Node::indent2string_abi_cxx11_(string *__return_storage_ptr__,Node *this,int indent)

{
  int iVar1;
  stringstream stream;
  stringstream asStack_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  iVar1 = (int)this + 1;
  while (iVar1 = iVar1 + -1, iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"  ",2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

static std::string indent2string(int indent = 0) {
            std::stringstream stream;
            while (indent--)
                stream << "  ";
            return stream.str();
        }